

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.cpp
# Opt level: O3

int __thiscall AC3Codec::decodeFrame(AC3Codec *this,uint8_t *buf,uint8_t *end,int *skipBytes)

{
  byte bVar1;
  AC3ParseError AVar2;
  long lVar3;
  uint8_t *extraout_RDX;
  uint8_t *end_00;
  uint8_t *extraout_RDX_00;
  uint8_t *buffer;
  byte *buf_00;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  if ((long)end - (long)buf < 2) goto LAB_00175043;
  if (this->m_state == stateDecodeAC3) {
LAB_00175090:
    *skipBytes = 0;
    AVar2 = parseHeader(this,buf,end);
    if (AVar2 == NOT_ENOUGH_BUFFER) {
      return -10;
    }
    if (AVar2 == NO_ERROR) {
      lVar3 = (long)this->m_samples * 0x13b6d8300;
      end_00 = (uint8_t *)(lVar3 % (long)this->m_sample_rate);
      this->m_frameDuration = lVar3 / (long)this->m_sample_rate;
      uVar5 = this->m_frame_size;
      goto LAB_001750dd;
    }
LAB_00175170:
    iVar4 = 0;
  }
  else {
    uVar5 = 0;
    end_00 = end;
    if ((*buf == '\v') && (buf[1] == 'w')) {
      AVar2 = testParseHeader(this,buf,end);
      if (AVar2 == NO_ERROR) {
        this->m_state = stateDecodeAC3;
      }
      else {
        end_00 = extraout_RDX;
        if (this->m_state != stateDecodeAC3) goto LAB_001750dd;
      }
      goto LAB_00175090;
    }
LAB_001750dd:
    bVar1 = this->m_true_hd_mode;
    if ((this->m_testMode == true) && ((bVar1 & 1) == 0)) {
      buffer = buf + (int)uVar5;
      if (7 < (long)end - (long)buffer) {
        if ((((*buffer != '\v') || (buffer[1] != 'w')) && (buffer[4] == 0xf8)) &&
           ((buffer[5] == 'r' && (buffer[6] == 'o')))) {
          if ((ulong)((long)end - (long)buffer) < 0x15) goto LAB_00175043;
          bVar1 = MLPCodec::decodeFrame(&this->mlp,buffer,buffer + 0x15);
          this->m_true_hd_mode = (bool)bVar1;
          end_00 = extraout_RDX_00;
        }
        goto LAB_001750ee;
      }
    }
    else {
LAB_001750ee:
      if ((bVar1 & 1) == 0) {
        if (this->m_downconvertToAC3 != true) {
          return uVar5;
        }
        if (this->m_bsid < 0xb) {
          return uVar5;
        }
LAB_0017516d:
        *skipBytes = uVar5;
        goto LAB_00175170;
      }
      buf_00 = buf + (int)uVar5;
      if (6 < (long)end - (long)buf_00) {
        if (this->m_state == stateDecodeAC3) {
          if (((*buf_00 == 0xb) && (buf_00[1] == 0x77)) &&
             (AVar2 = testParseHeader(this,buf_00,end_00), AVar2 == NO_ERROR)) {
            return uVar5;
          }
          this->m_waitMoreData = true;
          this->m_state = stateDecodeTrueHDFirst;
          return uVar5;
        }
        this->m_state = stateDecodeTrueHD;
        uVar5 = (*buf_00 & 0xf) * 0x200 + (uint)buf_00[1] * 2;
        uVar6 = (ulong)uVar5;
        if (uVar6 <= (ulong)((long)end - (long)buf_00)) {
          if (((buf_00[uVar6] == 0xb) && ((buf_00 + uVar6)[1] == 0x77)) &&
             (AVar2 = testParseHeader(this,buf_00 + uVar6,end_00), AVar2 == NO_ERROR)) {
            this->m_waitMoreData = false;
          }
          if (this->m_downconvertToAC3 != true) {
            return uVar5;
          }
          goto LAB_0017516d;
        }
      }
    }
LAB_00175043:
    iVar4 = -10;
  }
  return iVar4;
}

Assistant:

int AC3Codec::decodeFrame(uint8_t *buf, uint8_t *end, int &skipBytes)
{
    try
    {
        int rez = 0;

        if (end - buf < 2)
            return NOT_ENOUGH_BUFFER;
        if (m_state != AC3State::stateDecodeAC3 && buf[0] == 0x0B && buf[1] == 0x77)
        {
            if (testDecodeTestFrame(buf, end))
                m_state = AC3State::stateDecodeAC3;
        }

        if (m_state == AC3State::stateDecodeAC3)
        {
            skipBytes = 0;
            const AC3ParseError err = parseHeader(buf, end);

            if (err == AC3ParseError::NOT_ENOUGH_BUFFER)
                return NOT_ENOUGH_BUFFER;

            if (err != AC3ParseError::NO_ERROR)
                return 0;  // parse error

            m_frameDuration = (INTERNAL_PTS_FREQ * m_samples) / m_sample_rate;
            rez = m_frame_size;
        }

        if (getTestMode() && !m_true_hd_mode)
        {
            uint8_t *trueHDData = buf + rez;
            if (end - trueHDData < 8)
                return NOT_ENOUGH_BUFFER;
            if (!isSyncWord(trueHDData) && isHDSyncWord(trueHDData + 4))
            {
                if (end - trueHDData < 21)
                    return NOT_ENOUGH_BUFFER;
                m_true_hd_mode = mlp.decodeFrame(trueHDData, trueHDData + 21);
            }
        }

        if ((m_true_hd_mode))  // omit AC3+
        {
            uint8_t *trueHDData = buf + rez;
            if (end - trueHDData < 7)
                return NOT_ENOUGH_BUFFER;
            if (m_state == AC3State::stateDecodeAC3)
            {
                // check if it is a real HD frame

                if (trueHDData[0] != 0x0B || trueHDData[1] != 0x77 || !testDecodeTestFrame(trueHDData, end))
                {
                    m_waitMoreData = true;
                    m_state = AC3State::stateDecodeTrueHDFirst;
                }
                return rez;
            }
            m_state = AC3State::stateDecodeTrueHD;
            int trueHDFrameLen = (trueHDData[0] & 0x0f) << 8;
            trueHDFrameLen += trueHDData[1];
            trueHDFrameLen *= 2;
            if (end - trueHDData < static_cast<int64_t>(trueHDFrameLen))
                return NOT_ENOUGH_BUFFER;
            if (!m_true_hd_mode)
            {
                m_true_hd_mode = mlp.decodeFrame(trueHDData, trueHDData + trueHDFrameLen);
            }
            uint8_t *nextFrame = trueHDData + trueHDFrameLen;

            if (nextFrame[0] == 0x0B && nextFrame[1] == 0x77 && testDecodeTestFrame(nextFrame, end))
                m_waitMoreData = false;

            if (m_downconvertToAC3)
            {
                skipBytes = trueHDFrameLen;
                return 0;
            }
            return trueHDFrameLen;
        }
        if (m_downconvertToAC3 && m_bsid > 10)
        {
            skipBytes = rez;  // skip E-AC3 frame
            return 0;
        }
        return rez;
    }
    catch (BitStreamException &)
    {
        return NOT_ENOUGH_BUFFER;
    }
}